

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundary.c
# Opt level: O2

void applyPbndCond(double **P,lattice *grid,char **FLAG)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  bVar1 = grid->edges;
  if ((bVar1 & 4) != 0) {
    uVar5 = 0;
    uVar6 = (ulong)(uint)grid->delj;
    if (grid->delj < 1) {
      uVar6 = uVar5;
    }
    for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      (*P)[uVar5 + 1] = P[1][uVar5 + 1];
    }
  }
  if ((bVar1 & 8) != 0) {
    uVar5 = 0;
    uVar6 = (ulong)(uint)grid->delj;
    if (grid->delj < 1) {
      uVar6 = uVar5;
    }
    for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      P[(long)grid->deli + 1][uVar5 + 1] = P[grid->deli][uVar5 + 1];
    }
  }
  if ((bVar1 & 2) != 0) {
    uVar5 = 0;
    uVar6 = (ulong)(uint)grid->deli;
    if (grid->deli < 1) {
      uVar6 = uVar5;
    }
    for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      *P[uVar5 + 1] = P[uVar5 + 1][1];
    }
  }
  uVar2 = grid->deli;
  if ((bVar1 & 1) == 0) {
    uVar3 = 0;
    if (0 < (int)uVar2) {
      uVar3 = uVar2;
    }
  }
  else {
    uVar5 = 0;
    uVar6 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar6 = uVar5;
    }
    for (; uVar3 = (uint)uVar6, uVar6 != uVar5; uVar5 = uVar5 + 1) {
      P[uVar5 + 1][(long)grid->delj + 1] = P[uVar5 + 1][grid->delj];
    }
  }
  dVar8 = grid->delx * grid->delx;
  dVar9 = grid->dely * grid->dely;
  for (uVar6 = 1; uVar6 != uVar3 + 1; uVar6 = uVar6 + 1) {
    uVar2 = grid->delj;
    if (grid->delj < 1) {
      uVar2 = 0;
    }
    for (lVar7 = 1; lVar7 - (ulong)uVar2 != 1; lVar7 = lVar7 + 1) {
      bVar1 = FLAG[uVar6][lVar7];
      uVar4 = bVar1 & 0xf;
      if (uVar4 != 0xf) {
        dVar12 = 0.0;
        dVar10 = 1.0;
        if ((byte)uVar4 != 0) {
          dVar10 = 0.0;
        }
        dVar11 = 1.0;
        if ((bVar1 & 10) == 0) {
          dVar11 = 0.0;
        }
        dVar13 = 1.0;
        if ((bVar1 & 5) == 0) {
          dVar13 = 0.0;
        }
        else {
          dVar12 = P[uVar6][(int)((bVar1 & 1) + (int)lVar7 + ((int)(uVar4 << 0x1d) >> 0x1f))] *
                   dVar8 + 0.0;
        }
        if ((bVar1 & 10) != 0) {
          dVar12 = dVar12 + P[(int)((((byte)uVar4 < 8) - 1) + (int)uVar6 + (uVar4 >> 1 & 1))][lVar7]
                            * dVar9;
        }
        P[uVar6][lVar7] = dVar12 / (dVar11 * dVar9 + dVar13 * dVar8 + dVar10);
      }
    }
  }
  return;
}

Assistant:

void applyPbndCond (REAL **P, lattice *grid, char **FLAG)
{
	/* Apply boundary conditions for the pressure field */
	char flag = 0;
	/* First set values on the actual boundary of the region */
	if (grid->edges & LEFT)
		for (int j = 1; j <= grid->delj; j++)
			P[0][j] = P[1][j];
	if (grid->edges & RIGHT)
		for (int j = 1; j <= grid->delj; j++)
			P[grid->deli+1][j] = P[grid->deli][j];
	if (grid->edges & BOTTOM)
		for (int i = 1; i <= grid->deli; i++)
			P[i][0] = P[i][1];
	if (grid->edges & TOP)
		for (int i = 1; i <= grid->deli; i++)
			P[i][grid->delj+1] = P[i][grid->delj];
	REAL dxSqrd = sqr(grid->delx);
	REAL dySqrd = sqr(grid->dely);
	REAL num, denom;
	int delNS, delOW;
	for (int i = 1; i <= grid->deli; i++)
		for (int j = 1; j <= grid->delj; j++)
		{
			flag = LO_NIBBLE(FLAG[i][j]);
			if (flag == C_F)
				continue;
			num = 0;
			denom = (flag == C_B) + ((flag & B_NS) != 0)*dxSqrd + ((flag & B_OW) != 0)*dySqrd;
			delNS = ((flag & B_N) != 0) - ((flag & B_S) != 0);
			delOW = ((flag & B_O) != 0) - ((flag & B_W) != 0);

			if (flag & B_NS)
				num += P[i][j+delNS] * dxSqrd;
			if (flag & B_OW)
				num += P[i+delOW][j] * dySqrd;

			P[i][j] = num / denom;
		}
	return;
}